

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O3

bool __thiscall
Am_Value_List_Data::operator==(Am_Value_List_Data *this,Am_Value_List_Data *test_value)

{
  bool bVar1;
  Am_List_Item *test_value_00;
  Am_List_Item *this_00;
  
  test_value_00 = test_value->head;
  this_00 = this->head;
  if (test_value_00 != (Am_List_Item *)0x0 && this_00 != (Am_List_Item *)0x0) {
    do {
      bVar1 = Am_Value::operator==(&this_00->super_Am_Value,&test_value_00->super_Am_Value);
      if (!bVar1) {
        return false;
      }
      test_value_00 = test_value_00->next;
      this_00 = this_00->next;
    } while ((this_00 != (Am_List_Item *)0x0) && (test_value_00 != (Am_List_Item *)0x0));
  }
  return test_value_00 == (Am_List_Item *)0x0 && this_00 == (Am_List_Item *)0x0;
}

Assistant:

bool
Am_Value_List_Data::operator==(const Am_Value_List_Data &test_value) const
{
  Am_List_Item *curr1 = head;
  Am_List_Item *curr2 = test_value.head;
  while ((curr1 != nullptr) && (curr2 != nullptr)) {
    if (!(*curr1 == *curr2))
      return false;
    curr1 = curr1->next;
    curr2 = curr2->next;
  }
  return (curr1 == nullptr) && (curr2 == nullptr);
}